

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void pstack::
     print_container<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*container;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)container[1];
  if (pbVar3 != pbVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      local_40.object = pbVar3;
      local_40.context = ctx;
      operator<<(os,&local_40);
      pbVar3 = pbVar3 + 1;
      __s = ",\n";
    } while (pbVar3 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}